

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_encrypt
              (secp256k1_context *ctx,uchar *adaptor_sig162,uchar *seckey32,secp256k1_pubkey *enckey
              ,uchar *msg32,secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  code *pcVar8;
  size_t pubkey_size;
  size_t size;
  uchar p1_33 [33];
  secp256k1_scalar k;
  secp256k1_scalar k_1;
  secp256k1_scalar n;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  uchar nonce32 [32];
  secp256k1_scalar sp;
  uchar sk32 [32];
  uchar buf33 [33];
  uchar p2_33 [33];
  secp256k1_ge r;
  secp256k1_ge enckey_ge;
  secp256k1_ge rp;
  secp256k1_scalar msg;
  secp256k1_scalar sk;
  secp256k1_scalar sigr;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  size_t local_590;
  secp256k1_nonce_function_hardened_ecdsa_adaptor local_588;
  uchar *local_580;
  uchar *local_578;
  size_t local_570;
  size_t local_568 [6];
  secp256k1_scalar local_538;
  secp256k1_scalar local_518;
  secp256k1_scalar local_4f8;
  secp256k1_scalar local_4c8;
  secp256k1_scalar local_4a8;
  uchar local_488 [32];
  secp256k1_ge local_468;
  uchar local_408 [32];
  uchar local_3e8 [48];
  uchar local_3b8 [40];
  secp256k1_ge local_390;
  secp256k1_ge local_338;
  secp256k1_ge local_2e0;
  secp256k1_gej local_288;
  secp256k1_gej local_208;
  secp256k1_ge local_188;
  secp256k1_gej local_130;
  secp256k1_gej local_b0;
  
  local_488[0x10] = '\0';
  local_488[0x11] = '\0';
  local_488[0x12] = '\0';
  local_488[0x13] = '\0';
  local_488[0x14] = '\0';
  local_488[0x15] = '\0';
  local_488[0x16] = '\0';
  local_488[0x17] = '\0';
  local_488[0x18] = '\0';
  local_488[0x19] = '\0';
  local_488[0x1a] = '\0';
  local_488[0x1b] = '\0';
  local_488[0x1c] = '\0';
  local_488[0x1d] = '\0';
  local_488[0x1e] = '\0';
  local_488[0x1f] = '\0';
  local_488[0] = '\0';
  local_488[1] = '\0';
  local_488[2] = '\0';
  local_488[3] = '\0';
  local_488[4] = '\0';
  local_488[5] = '\0';
  local_488[6] = '\0';
  local_488[7] = '\0';
  local_488[8] = '\0';
  local_488[9] = '\0';
  local_488[10] = '\0';
  local_488[0xb] = '\0';
  local_488[0xc] = '\0';
  local_488[0xd] = '\0';
  local_488[0xe] = '\0';
  local_488[0xf] = '\0';
  local_570 = 0x21;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_adaptor_encrypt_cold_5();
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_encrypt_cold_4();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_encrypt_cold_3();
  }
  else if (enckey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_encrypt_cold_2();
  }
  else {
    if (msg32 != (uchar *)0x0) {
      local_4c8.d[2] = 0;
      local_4c8.d[3] = 0;
      local_4c8.d[0] = 0;
      local_4c8.d[1] = 0;
      local_4a8.d[0] = 0;
      local_4a8.d[1] = 0;
      local_4a8.d[2] = 0;
      local_4a8.d[3] = 0;
      pcVar8 = nonce_function_ecdsa_adaptor;
      if (noncefp != (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0) {
        pcVar8 = noncefp;
      }
      uVar2 = secp256k1_pubkey_load(ctx,&local_338,enckey);
      uVar3 = secp256k1_eckey_pubkey_serialize(&local_338,local_3e8,&local_570,1);
      uVar3 = uVar3 & uVar2;
      local_588 = pcVar8;
      local_580 = seckey32;
      local_578 = msg32;
      iVar4 = (*pcVar8)(local_488,msg32,seckey32,local_3e8,"ECDSAadaptor/non",0x10,ndata);
      secp256k1_scalar_set_b32(&local_538,local_488,(int *)0x0);
      if (iVar4 == 0) {
        uVar3 = 0;
      }
      if (((local_538.d[1] == 0 && local_538.d[0] == 0) && local_538.d[2] == 0) &&
          local_538.d[3] == 0) {
        uVar3 = 0;
      }
      uVar1 = (ulong)(uVar3 ^ 1) - 1;
      local_538.d[0] = local_538.d[0] & uVar1 | (ulong)(uVar3 ^ 1);
      local_538.d[1] = local_538.d[1] & uVar1;
      local_538.d[2] = local_538.d[2] & uVar1;
      local_538.d[3] = uVar1 & local_538.d[3];
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_130,&local_538);
      secp256k1_ge_set_gej(&local_2e0,&local_130);
      secp256k1_ecmult_const(&local_b0,&local_338,&local_538,0x100);
      secp256k1_ge_set_gej(&local_390,&local_b0);
      local_518.d[2] = 0;
      local_518.d[3] = 0;
      local_518.d[0] = 0;
      local_518.d[1] = 0;
      local_590 = 0x21;
      secp256k1_scalar_get_b32(local_408,&local_538);
      iVar4 = secp256k1_eckey_pubkey_serialize(&local_338,(uchar *)&local_4f8,&local_590,1);
      uVar2 = 0;
      if (iVar4 != 0) {
        iVar4 = secp256k1_eckey_pubkey_serialize(&local_2e0,(uchar *)local_568,&local_590,1);
        uVar2 = 0;
        if (iVar4 != 0) {
          iVar4 = secp256k1_eckey_pubkey_serialize(&local_390,local_3b8,&local_590,1);
          uVar2 = 0;
          if (iVar4 != 0) {
            local_208.x.n[0] = 0xbb67ae856a09e667;
            local_208.x.n[1] = 0xa54ff53a3c6ef372;
            local_208.x.n[2] = 0x9b05688c510e527f;
            local_208.x.n[3] = 0x5be0cd191f83d9ab;
            local_208.z.n[2] = 0;
            secp256k1_sha256_write((secp256k1_sha256 *)&local_208,(uchar *)local_568,0x21);
            secp256k1_sha256_write((secp256k1_sha256 *)&local_208,local_3b8,0x21);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&local_208,(uchar *)&local_288);
            iVar4 = (*local_588)((uchar *)&local_468,(uchar *)&local_288,local_408,
                                 (uchar *)&local_4f8,"DLEQ",4,ndata);
            if (iVar4 == 0) {
              uVar2 = 0;
            }
            else {
              secp256k1_scalar_set_b32(&local_518,(uchar *)&local_468,(int *)0x0);
              uVar2 = (uint)(((local_518.d[1] != 0 || local_518.d[0] != 0) || local_518.d[2] != 0)
                            || local_518.d[3] != 0);
            }
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_208,&local_518);
            secp256k1_ge_set_gej(&local_468,&local_208);
            secp256k1_ecmult_const(&local_288,&local_338,&local_518,0x100);
            secp256k1_ge_set_gej(&local_188,&local_288);
            secp256k1_dleq_challenge
                      (&local_4c8,&local_338,&local_468,&local_188,&local_2e0,&local_390);
            secp256k1_scalar_mul(&local_4a8,&local_4c8,&local_538);
            secp256k1_scalar_add(&local_4a8,&local_4a8,&local_518);
            local_518.d[2] = 0;
            local_518.d[3] = 0;
            local_518.d[0] = 0;
            local_518.d[1] = 0;
          }
        }
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_208,local_580,(int *)&local_288);
      if ((local_208.x.n[2] == 0 && local_208.x.n[3] == 0) &&
          (local_208.x.n[1] == 0 && local_208.x.n[0] == 0)) {
        uVar2 = 0;
      }
      if ((int)local_288.x.n[0] != 0) {
        uVar2 = 0;
      }
      uVar7 = (ulong)(uVar2 & uVar3 ^ 1);
      uVar1 = uVar7 - 1;
      local_208.x.n[0] = local_208.x.n[0] & uVar1 | uVar7;
      local_208.x.n[1] = local_208.x.n[1] & uVar1;
      local_208.x.n[2] = local_208.x.n[2] & uVar1;
      local_208.x.n[3] = uVar1 & local_208.x.n[3];
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_288,local_578,(int *)0x0);
      secp256k1_fe_normalize(&local_390.x);
      secp256k1_fe_get_b32(local_3e8,&local_390.x);
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_188,local_3e8,(int *)0x0);
      secp256k1_scalar_mul(&local_4f8,(secp256k1_scalar *)&local_188,(secp256k1_scalar *)&local_208)
      ;
      secp256k1_scalar_add(&local_4f8,&local_4f8,(secp256k1_scalar *)&local_288);
      secp256k1_scalar_inverse((secp256k1_scalar *)&local_468,&local_538);
      secp256k1_scalar_mul((secp256k1_scalar *)&local_468,(secp256k1_scalar *)&local_468,&local_4f8)
      ;
      local_568[0] = 0x21;
      iVar4 = secp256k1_eckey_pubkey_serialize(&local_390,adaptor_sig162,local_568,1);
      if (iVar4 == 0) {
        uVar5 = 0;
      }
      else {
        iVar4 = secp256k1_eckey_pubkey_serialize(&local_2e0,adaptor_sig162 + 0x21,local_568,1);
        uVar5 = 0;
        if (iVar4 != 0) {
          secp256k1_scalar_get_b32(adaptor_sig162 + 0x42,(secp256k1_scalar *)&local_468);
          secp256k1_scalar_get_b32(adaptor_sig162 + 0x62,&local_4c8);
          secp256k1_scalar_get_b32(adaptor_sig162 + 0x82,&local_4a8);
          uVar5 = 1;
        }
      }
      uVar3 = uVar5 & ~(uint)(((local_468.x.n[1] == 0 && local_468.x.n[0] == 0) &&
                              local_468.x.n[2] == 0) && local_468.x.n[3] == 0 ||
                             ((local_188.x.n[1] == 0 && local_188.x.n[0] == 0) &&
                             local_188.x.n[2] == 0) && local_188.x.n[3] == 0) & uVar2 & uVar3;
      lVar6 = 0;
      do {
        adaptor_sig162[lVar6] = adaptor_sig162[lVar6] & ((byte)uVar3 ^ 1) - 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xa2);
      return uVar3;
    }
    secp256k1_ecdsa_adaptor_encrypt_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_encrypt(const secp256k1_context* ctx, unsigned char *adaptor_sig162, unsigned char *seckey32, const secp256k1_pubkey *enckey, const unsigned char *msg32, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge enckey_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_scalar n;
    unsigned char nonce32[32] = { 0 };
    unsigned char buf33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(enckey != NULL);
    ARG_CHECK(msg32 != NULL);

    secp256k1_scalar_clear(&dleq_proof_e);
    secp256k1_scalar_clear(&dleq_proof_s);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_ecdsa_adaptor;
    }

    ret &= secp256k1_pubkey_load(ctx, &enckey_ge, enckey);
    ret &= secp256k1_eckey_pubkey_serialize(&enckey_ge, buf33, &size, 1);
    ret &= !!noncefp(nonce32, msg32, seckey32, buf33, ecdsa_adaptor_algo, sizeof(ecdsa_adaptor_algo), ndata);
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    /* R' := k*G */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);
    secp256k1_ge_set_gej(&rp, &rpj);
    /* R = k*Y; */
    secp256k1_ecmult_const(&rj, &enckey_ge, &k, 256);
    secp256k1_ge_set_gej(&r, &rj);
    /* We declassify the non-secret values rp and r to allow using them
     * as branch points. */
    secp256k1_declassify(ctx, &rp, sizeof(rp));
    secp256k1_declassify(ctx, &r, sizeof(r));

    /* dleq_proof = DLEQ_prove(k, (R', Y, R)) */
    ret &= secp256k1_dleq_prove(ctx, &dleq_proof_s, &dleq_proof_e, &k, &enckey_ge, &rp, &r, noncefp, ndata);

    ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey32);
    secp256k1_scalar_cmov(&sk, &secp256k1_scalar_one, !ret);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_get_b32(buf33, &r.x);
    secp256k1_scalar_set_b32(&sigr, buf33, NULL);
    ret &= !secp256k1_scalar_is_zero(&sigr);
    /* s' = k⁻¹(m + R.x * x) */
    secp256k1_scalar_mul(&n, &sigr, &sk);
    secp256k1_scalar_add(&n, &n, &msg);
    secp256k1_scalar_inverse(&sp, &k);
    secp256k1_scalar_mul(&sp, &sp, &n);
    ret &= !secp256k1_scalar_is_zero(&sp);

    /* return (R, R', s', dleq_proof) */
    ret &= secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig162, &r, &rp, &sp, &dleq_proof_e, &dleq_proof_s);

    secp256k1_memczero(adaptor_sig162, 162, !ret);
    secp256k1_scalar_clear(&n);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);

    return ret;
}